

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThermoIntegrationForceModifier.cpp
# Opt level: O3

void __thiscall
OpenMD::ThermoIntegrationForceModifier::modifyForces(ThermoIntegrationForceModifier *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer ppSVar5;
  StuntDouble *pSVar6;
  Snapshot *pSVar7;
  RealType RVar8;
  undefined8 uVar9;
  Molecule *pMVar10;
  double (*padVar11) [3];
  uint i_2;
  pointer ppSVar12;
  uint j;
  uint i;
  long lVar13;
  long lVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  MoleculeIterator mi;
  Mat3x3d tempTau;
  double local_f8 [4];
  double local_d8 [4];
  RealType local_b8;
  MoleculeIterator local_b0;
  Mat3x3d local_a8;
  Mat3x3d local_58;
  
  local_b0._M_node = (_Base_ptr)0x0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  pMVar10 = SimInfo::beginMolecule
                      ((this->super_RestraintForceModifier).super_ForceModifier.info_,&local_b0);
  if (pMVar10 != (Molecule *)0x0) {
    do {
      ppSVar5 = (pMVar10->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppSVar12 = (pMVar10->integrableObjects_).
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          (ppSVar12 != ppSVar5 && (pSVar6 = *ppSVar12, pSVar6 != (StuntDouble *)0x0));
          ppSVar12 = ppSVar12 + 1) {
        lVar13 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
        local_d8[2] = (double)*(undefined8 *)(lVar13 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar13 + (long)pSVar6->localIndex_ * 0x18);
        local_d8[0] = *pdVar1;
        local_d8[1] = pdVar1[1];
        dVar2 = this->factor_;
        lVar13 = 0;
        do {
          local_d8[lVar13] = local_d8[lVar13] * dVar2;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        pSVar7 = pSVar6->snapshotMan_->currentSnapshot_;
        lVar14 = (long)pSVar6->localIndex_;
        lVar13 = *(long *)((long)&(pSVar7->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
        *(double *)(lVar13 + 0x10 + lVar14 * 0x18) = local_d8[2];
        pdVar1 = (double *)(lVar13 + lVar14 * 0x18);
        *pdVar1 = local_d8[0];
        pdVar1[1] = local_d8[1];
        if (pSVar6->objType_ - otDAtom < 2) {
          lVar13 = *(long *)((long)&(pSVar7->atomData).torque.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
          local_f8[2] = (double)*(undefined8 *)(lVar13 + 0x10 + lVar14 * 0x18);
          pdVar1 = (double *)(lVar13 + lVar14 * 0x18);
          local_f8[0] = *pdVar1;
          local_f8[1] = pdVar1[1];
          dVar2 = this->factor_;
          lVar13 = 0;
          do {
            local_f8[lVar13] = local_f8[lVar13] * dVar2;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          iVar4 = pSVar6->localIndex_;
          lVar13 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).torque.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
          *(double *)(lVar13 + 0x10 + (long)iVar4 * 0x18) = local_f8[2];
          pdVar1 = (double *)(lVar13 + (long)iVar4 * 0x18);
          *pdVar1 = local_f8[0];
          pdVar1[1] = local_f8[1];
        }
      }
      pMVar10 = SimInfo::nextMolecule
                          ((this->super_RestraintForceModifier).super_ForceModifier.info_,&local_b0)
      ;
    } while (pMVar10 != (Molecule *)0x0);
  }
  pSVar7 = ((this->super_RestraintForceModifier).super_ForceModifier.info_)->sman_->currentSnapshot_
  ;
  RVar8 = Snapshot::getPotentialEnergy(pSVar7);
  Snapshot::setRawPotential(pSVar7,RVar8);
  local_b8 = Snapshot::getRestraintPotential(pSVar7);
  dVar2 = RVar8 * this->factor_;
  Snapshot::setPotentialEnergy(pSVar7,dVar2);
  Snapshot::getVirialTensor(&local_58,pSVar7);
  lVar13 = 0;
  do {
    *(undefined8 *)
     ((long)local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar13 + 0x10) =
         *(undefined8 *)
          ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar13 + 0x10);
    uVar9 = *(undefined8 *)
             ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
             + lVar13 + 8);
    *(undefined8 *)
     ((long)local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar13) = *(undefined8 *)
                ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                       [0] + lVar13);
    *(undefined8 *)
     ((long)local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar13 + 8) = uVar9;
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0x48);
  dVar3 = this->factor_;
  padVar11 = (double (*) [3])&local_a8;
  lVar13 = 0;
  do {
    lVar14 = 0;
    do {
      (((SquareMatrix<double,_3> *)*padVar11)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar14] =
           (((SquareMatrix<double,_3> *)*padVar11)->super_RectMatrix<double,_3U,_3U>).data_[0]
           [lVar14] * dVar3;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    lVar13 = lVar13 + 1;
    padVar11 = padVar11 + 1;
  } while (lVar13 != 3);
  Snapshot::setVirialTensor(pSVar7,&local_a8);
  uVar15 = 0;
  uVar16 = 0;
  local_d8[3] = 0.0;
  if ((this->simParam_->UseRestraints).super_ParameterBase.field_0x2b == '\x01') {
    RVar8 = RestraintForceModifier::doRestraints
                      (&this->super_RestraintForceModifier,1.0 - this->factor_);
    uVar15 = SUB84(RVar8,0);
    uVar16 = (undefined4)((ulong)RVar8 >> 0x20);
    local_d8[3] = (this->super_RestraintForceModifier).unscaledPotential_;
  }
  Snapshot::setPotentialEnergy(pSVar7,dVar2 + (double)CONCAT44(uVar16,uVar15));
  Snapshot::setRestraintPotential(pSVar7,local_b8 + local_d8[3]);
  return;
}

Assistant:

void ThermoIntegrationForceModifier::modifyForces() {
    Snapshot* curSnapshot;
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;
    Vector3d frc;
    Vector3d trq;
    Mat3x3d tempTau;

    // now scale forces and torques of all the sds
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        frc = sd->getFrc();
        frc *= factor_;
        sd->setFrc(frc);

        if (sd->isDirectional()) {
          trq = sd->getTrq();
          trq *= factor_;
          sd->setTrq(trq);
        }
      }
    }

    curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    // set rawPotential to be the unscaled potential energy
    RealType rawPot = curSnapshot->getPotentialEnergy();
    curSnapshot->setRawPotential(rawPot);

    RealType rp = curSnapshot->getRestraintPotential();

    // scale the potential and update the snapshot
    rawPot *= factor_;
    curSnapshot->setPotentialEnergy(rawPot);

    // scale the virial tensor
    tempTau = curSnapshot->getVirialTensor();
    tempTau *= factor_;
    curSnapshot->setVirialTensor(tempTau);

    // now, on to the applied restraining potentials (if needed):
    RealType scaledRestPot(0.0);
    RealType restPot(0.0);

    if (simParam_->getUseRestraints()) {
      // do restraints from RestraintForceModifier:
      scaledRestPot = doRestraints(1.0 - factor_);
      restPot       = getUnscaledPotential();
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &scaledRestPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &restPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // give the final values to the snapshot
    curSnapshot->setPotentialEnergy(rawPot + scaledRestPot);
    curSnapshot->setRestraintPotential(rp + restPot);
  }